

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVaction INT_REVassoc_bridge_action
                   (CMConnection conn,EVstone stone,attr_list contact_list,EVstone remote_stone)

{
  int iVar1;
  CMFormat p_Var2;
  CMConnection conn_00;
  int in_ECX;
  CManager in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  EVassoc_bridge_action_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  EVaction in_stack_ffffffffffffffd4;
  
  memset(&stack0xffffffffffffffb8,0,0x18);
  iVar1 = INT_CMCondition_get((CManager)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (CMConnection)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  p_Var2 = INT_CMlookup_format((CManager)*in_RDI,EVassoc_bridge_action_req_formats);
  conn_00 = (CMConnection)attr_list_to_string(in_RDX);
  if (p_Var2 == (CMFormat)0x0) {
    INT_CMregister_format
              ((CManager)CONCAT44(in_stack_ffffffffffffffcc,in_ECX),(FMStructDescList)conn_00);
  }
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc,conn_00);
  INT_CMwrite(conn_00,(CMFormat)CONCAT44(in_ESI,iVar1),(void *)0x154843);
  free(conn_00);
  INT_CMCondition_wait(in_RDX,in_ECX);
  return in_stack_ffffffffffffffd4;
}

Assistant:

extern EVaction
INT_REVassoc_bridge_action(CMConnection conn, EVstone stone, attr_list contact_list, EVstone remote_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_bridge_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_bridge_action_req_formats);
    request.stone = stone;
    request.contact_list = attr_list_to_string(contact_list);
    request.remote_stone = remote_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_bridge_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    free(request.contact_list);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}